

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::FramebufferDefaultStateQueryTests::init
          (FramebufferDefaultStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  TestNode *pTVar3;
  FramebufferTest *pFVar4;
  char *desc;
  char *in_R9;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"framebuffer_default_width_",&local_61);
  std::operator+(&local_40,&local_60,"get_framebuffer_parameteriv");
  anon_unknown_1::FramebufferDimensionTest::FramebufferDimensionTest
            ((FramebufferDimensionTest *)pTVar3,pCVar1,QUERY_BOOLEAN,
             (DimensionType)local_40._M_dataplus._M_p,"Test FRAMEBUFFER_DEFAULT_WIDTH",in_R9);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"framebuffer_default_height_",&local_61);
  std::operator+(&local_40,&local_60,"get_framebuffer_parameteriv");
  desc = "Test FRAMEBUFFER_DEFAULT_HEIGHT";
  anon_unknown_1::FramebufferDimensionTest::FramebufferDimensionTest
            ((FramebufferDimensionTest *)pTVar3,pCVar1,QUERY_BOOLEAN_VEC4,
             (DimensionType)local_40._M_dataplus._M_p,"Test FRAMEBUFFER_DEFAULT_HEIGHT",in_R9);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  pFVar4 = (FramebufferTest *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"framebuffer_default_samples_",&local_61);
  std::operator+(&local_40,&local_60,"get_framebuffer_parameteriv");
  anon_unknown_1::FramebufferTest::FramebufferTest
            (pFVar4,pCVar1,(DimensionType)local_40._M_dataplus._M_p,
             "Test FRAMEBUFFER_DEFAULT_SAMPLES",desc);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e59b10;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar4);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  pFVar4 = (FramebufferTest *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"framebuffer_default_fixed_sample_locations_",&local_61);
  std::operator+(&local_40,&local_60,"get_framebuffer_parameteriv");
  anon_unknown_1::FramebufferTest::FramebufferTest
            (pFVar4,pCVar1,(DimensionType)local_40._M_dataplus._M_p,
             "Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS",desc);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e59b70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar4);
  std::__cxx11::string::~string((string *)&local_40);
  iVar2 = std::__cxx11::string::~string((string *)&local_60);
  return iVar2;
}

Assistant:

void FramebufferDefaultStateQueryTests::init (void)
{
	static const QueryType verifiers[] =
	{
		QUERY_FRAMEBUFFER_INTEGER,
	};

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];								\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_WIDTH,	(std::string("framebuffer_default_width_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_WIDTH"));
	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_HEIGHT,	(std::string("framebuffer_default_height_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_HEIGHT"));
	FOR_EACH_VERIFIER(new FramebufferSamplesTest				(m_context, verifier,												(std::string("framebuffer_default_samples_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_SAMPLES"));
	FOR_EACH_VERIFIER(new FramebufferFixedSampleLocationsTest	(m_context, verifier,												(std::string("framebuffer_default_fixed_sample_locations_") + verifierSuffix).c_str(),	"Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS"));

#undef FOR_EACH_VERIFIER
}